

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hh
# Opt level: O0

void __thiscall avro::StreamReader::skipBytes(StreamReader *this,size_t n)

{
  long lVar1;
  ulong in_RSI;
  undefined8 *in_RDI;
  
  if ((ulong)(in_RDI[2] - in_RDI[1]) < in_RSI) {
    lVar1 = in_RDI[1];
    in_RDI[1] = in_RDI[2];
    (**(code **)(*(long *)*in_RDI + 0x20))((long *)*in_RDI,in_RSI - (in_RDI[2] - lVar1));
  }
  else {
    in_RDI[1] = in_RSI + in_RDI[1];
  }
  return;
}

Assistant:

void skipBytes(size_t n) {
        if (n > static_cast<size_t>(end_ - next_)) {
            n -= end_ - next_;
            next_ = end_;
            in_->skip(n);
        } else {
            next_ += n;
        }
    }